

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O2

void move_pos(lzma_mf *mf)

{
  uint uVar1;
  uint32_t i;
  uint uVar2;
  ulong uVar3;
  uint32_t uVar4;
  
  uVar2 = mf->cyclic_pos + 1;
  uVar1 = 0;
  if (uVar2 != mf->cyclic_size) {
    uVar1 = uVar2;
  }
  mf->cyclic_pos = uVar1;
  uVar1 = mf->read_pos + 1;
  mf->read_pos = uVar1;
  if (uVar1 <= mf->write_pos) {
    if (uVar1 + mf->offset == -1) {
      uVar1 = ~mf->cyclic_size;
      for (uVar3 = 0; uVar3 < mf->hash_count; uVar3 = uVar3 + 1) {
        uVar2 = mf->hash[uVar3];
        uVar4 = uVar2 - uVar1;
        if (uVar2 < uVar1) {
          uVar4 = 0;
        }
        mf->hash[uVar3] = uVar4;
      }
      for (uVar3 = 0; uVar3 < mf->sons_count; uVar3 = uVar3 + 1) {
        uVar2 = mf->son[uVar3];
        uVar4 = uVar2 - uVar1;
        if (uVar2 < uVar1) {
          uVar4 = 0;
        }
        mf->son[uVar3] = uVar4;
      }
      mf->offset = mf->offset - uVar1;
    }
    return;
  }
  __assert_fail("mf->read_pos <= mf->write_pos",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                ,0x9c,"void move_pos(lzma_mf *)");
}

Assistant:

static void
move_pos(lzma_mf *mf)
{
	if (++mf->cyclic_pos == mf->cyclic_size)
		mf->cyclic_pos = 0;

	++mf->read_pos;
	assert(mf->read_pos <= mf->write_pos);

	if (unlikely(mf->read_pos + mf->offset == UINT32_MAX))
		normalize(mf);
}